

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool container_iterator_read_into_uint64
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint64_t high48,
                uint64_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Bool _Var5;
  ulong *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  long lVar19;
  
  *consumed = 0;
  auVar4 = _DAT_001341f0;
  auVar3 = _DAT_001341e0;
  if (count == 0) {
    return false;
  }
  if (typecode == '\x01') {
    iVar8 = it->index;
    iVar9 = iVar8 + 0x3f;
    if (-1 < iVar8) {
      iVar9 = iVar8;
    }
    uVar11 = (ulong)(uint)(iVar9 >> 6);
    lVar2 = *(long *)((long)c + 8);
    uVar14 = (*(ulong *)(lVar2 + uVar11 * 8) >> ((byte)iVar8 & 0x3f)) << ((byte)iVar8 & 0x3f);
    do {
      if (uVar14 != 0) {
        uVar7 = *consumed;
        uVar12 = count;
        if (count < uVar7) {
          uVar12 = uVar7;
        }
        do {
          uVar7 = uVar7 + 1;
          if (uVar7 - uVar12 == 1) break;
          lVar15 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          *buf = ((uint)lVar15 | (int)uVar11 << 6) | high48;
          buf = buf + 1;
          *consumed = uVar7;
          uVar14 = uVar14 & uVar14 - 1;
        } while (uVar14 != 0);
      }
      if ((uVar14 == 0) && (uVar7 = (int)uVar11 + 1, uVar7 < 0x400)) {
        puVar6 = (ulong *)(lVar2 + (ulong)uVar7 * 8);
        do {
          uVar7 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar7;
          uVar14 = *puVar6;
          if (uVar14 != 0) break;
          puVar6 = puVar6 + 1;
        } while (uVar7 < 0x3ff);
      }
      if (uVar14 == 0) {
        return uVar14 != 0;
      }
    } while (*consumed < count);
    lVar2 = 0;
    if (uVar14 != 0) {
      for (; (uVar14 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar7 = (uint)lVar2 | (int)uVar11 << 6;
    it->index = uVar7;
  }
  else {
    if (typecode != '\x02') {
      lVar2 = *(long *)((long)c + 8);
      uVar7 = (uint)*value_out;
      while( true ) {
        uVar10 = (uint)*(ushort *)(lVar2 + 2 + (long)it->index * 4) +
                 (uint)*(ushort *)(lVar2 + (long)it->index * 4);
        uVar7 = uVar7 & 0xffff;
        uVar13 = (uVar10 - uVar7) + 1;
        uVar12 = *consumed;
        uVar16 = count - uVar12;
        if (uVar13 < uVar16) {
          uVar16 = uVar13;
        }
        uVar14 = (ulong)uVar16;
        if (uVar16 != 0) {
          lVar15 = uVar14 - 1;
          auVar17._8_4_ = (int)lVar15;
          auVar17._0_8_ = lVar15;
          auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
          lVar15 = 1;
          auVar17 = auVar17 ^ auVar4;
          auVar18 = auVar3;
          uVar13 = uVar7;
          do {
            auVar20 = auVar18 ^ auVar4;
            if ((bool)(~(auVar17._4_4_ < auVar20._4_4_ ||
                        auVar17._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar17._4_4_) & 1)) {
              buf[lVar15 + -1] = uVar13 | high48;
            }
            if (auVar20._12_4_ <= auVar17._12_4_ &&
                (auVar20._8_4_ <= auVar17._8_4_ || auVar20._12_4_ != auVar17._12_4_)) {
              buf[lVar15] = uVar13 + 1 | high48;
            }
            lVar19 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar19 + 2;
            lVar19 = lVar15 - (uVar14 + 1 & 0xfffffffffffffffe);
            lVar15 = lVar15 + 2;
            uVar13 = uVar13 + 2;
          } while (lVar19 != -1);
        }
        uVar7 = uVar7 + uVar16;
        *value_out = (uint16_t)uVar7;
        *consumed = uVar12 + uVar16;
        _Var5 = true;
        if (((uint16_t)uVar7 == 0) || (uVar10 < (uVar7 & 0xffff))) {
          iVar8 = it->index;
          iVar9 = iVar8 + 1;
          it->index = iVar9;
          if (iVar9 < *c) {
            uVar1 = *(ushort *)(lVar2 + 4 + (long)iVar8 * 4);
            uVar7 = (uint)uVar1;
            *value_out = uVar1;
          }
          else {
            _Var5 = false;
          }
        }
        if (_Var5 == false) break;
        buf = buf + uVar14;
        if (count <= *consumed) {
          return _Var5;
        }
      }
      return false;
    }
    iVar8 = it->index;
    uVar7 = *c - iVar8;
    if (count <= uVar7) {
      uVar7 = count;
    }
    if (*c != iVar8) {
      lVar2 = *(long *)((long)c + 8);
      uVar14 = 0;
      do {
        buf[uVar14] = *(ushort *)(lVar2 + (ulong)(uint)(iVar8 + (int)uVar14) * 2) | high48;
        uVar14 = uVar14 + 1;
      } while (uVar7 + (uVar7 == 0) != uVar14);
    }
    *consumed = uVar7;
    iVar8 = uVar7 + it->index;
    it->index = iVar8;
    if (*c <= iVar8) {
      return iVar8 < *c;
    }
    uVar7 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar8 * 2);
  }
  *value_out = (uint16_t)uVar7;
  return true;
}

Assistant:

bool container_iterator_read_into_uint64(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint64_t high48, uint64_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high48 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high48 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high48 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}